

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O2

void __thiscall
ScenePreprocessorTest_testMeshPreprocessingPos_Test::TestBody
          (ScenePreprocessorTest_testMeshPreprocessingPos_Test *this)

{
  aiMesh *this_00;
  undefined8 *puVar1;
  aiVector3D *paVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  AssertionResult gtest_ar;
  
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  this_00->mNumFaces = 100;
  puVar1 = (undefined8 *)operator_new__(0x648);
  *puVar1 = 100;
  lVar3 = 0x10;
  do {
    *(undefined4 *)((long)puVar1 + lVar3 + -8) = 0;
    *(undefined8 *)((long)puVar1 + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x650);
  this_00->mFaces = (aiFace *)(puVar1 + 1);
  paVar2 = (aiVector3D *)operator_new__(0x78);
  paVar2->x = 0.0;
  paVar2->y = 0.0;
  *(undefined8 *)&paVar2->z = 0;
  paVar2[1].y = 0.0;
  paVar2[1].z = 0.0;
  paVar2[2].x = 0.0;
  paVar2[2].y = 0.0;
  *(undefined8 *)&paVar2[2].z = 0;
  paVar2[3].y = 0.0;
  paVar2[3].z = 0.0;
  paVar2[4].x = 0.0;
  paVar2[4].y = 0.0;
  *(undefined8 *)&paVar2[4].z = 0;
  paVar2[5].y = 0.0;
  paVar2[5].z = 0.0;
  paVar2[6].x = 0.0;
  paVar2[6].y = 0.0;
  paVar2[9].y = 0.0;
  paVar2[9].z = 0.0;
  *(undefined8 *)&paVar2[6].z = 0;
  paVar2[7].y = 0.0;
  paVar2[7].z = 0.0;
  paVar2[8].x = 0.0;
  paVar2[8].y = 0.0;
  *(undefined8 *)&paVar2[8].z = 0;
  this_00->mTextureCoords[0] = paVar2;
  this_00->mNumUVComponents[0] = 0;
  this_00->mNumUVComponents[1] = 0;
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,this_00,1,1);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,this_00,2,2);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,this_00,3,4);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,this_00,4,8);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,this_00,0x4e1,8);
  lVar3 = 0;
  for (uVar4 = 0; uVar5 = this_00->mNumFaces, uVar4 < uVar5 >> 1; uVar4 = uVar4 + 1) {
    *(undefined4 *)((long)&this_00->mFaces->mNumIndices + lVar3) = 3;
    lVar3 = lVar3 + 0x10;
  }
  for (; uVar4 < uVar5 - (uVar5 >> 2); uVar4 = uVar4 + 1) {
    *(undefined4 *)((long)&this_00->mFaces->mNumIndices + lVar3) = 4;
    uVar5 = this_00->mNumFaces;
    lVar3 = lVar3 + 0x10;
  }
  for (; uVar4 < uVar5; uVar4 = uVar4 + 1) {
    *(undefined4 *)((long)&this_00->mFaces->mNumIndices + lVar3) = 10;
    uVar5 = this_00->mNumFaces;
    lVar3 = lVar3 + 0x10;
  }
  ScenePreprocessorTest::ProcessMesh(&this->super_ScenePreprocessorTest,this_00);
  local_50.ptr_._0_4_ = 0xc;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,
             "static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON)",
             "p->mPrimitiveTypes",(uint *)&local_50,(uint *)this_00);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x8c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_50.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"2U","p->mNumUVComponents[0]",(uint *)&local_50,
             this_00->mNumUVComponents);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x8d,pcVar6);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_50.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"0U","p->mNumUVComponents[1]",(uint *)&local_50,
             this_00->mNumUVComponents + 1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x8e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  aiMesh::~aiMesh(this_00);
  operator_delete(this_00);
  return;
}

Assistant:

TEST_F(ScenePreprocessorTest, testMeshPreprocessingPos) {
    aiMesh* p = new aiMesh;
    p->mNumFaces = 100;
    p->mFaces = new aiFace[p->mNumFaces];

    p->mTextureCoords[0] = new aiVector3D[10];
    p->mNumUVComponents[0] = 0;
    p->mNumUVComponents[1] = 0;

    CheckIfOnly(p,1,aiPrimitiveType_POINT);
    CheckIfOnly(p,2,aiPrimitiveType_LINE);
    CheckIfOnly(p,3,aiPrimitiveType_TRIANGLE);
    CheckIfOnly(p,4,aiPrimitiveType_POLYGON);
    CheckIfOnly(p,1249,aiPrimitiveType_POLYGON);

    // Polygons and triangles mixed
    unsigned i;
    for (i = 0; i < p->mNumFaces/2;++i) {
        p->mFaces[i].mNumIndices = 3;
    }
    for (; i < p->mNumFaces-p->mNumFaces/4;++i) {
        p->mFaces[i].mNumIndices = 4;
    }
    for (; i < p->mNumFaces;++i)    {
        p->mFaces[i].mNumIndices = 10;
    }
    ProcessMesh(p);
    EXPECT_EQ(static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON),
              p->mPrimitiveTypes);
    EXPECT_EQ(2U, p->mNumUVComponents[0]);
    EXPECT_EQ(0U, p->mNumUVComponents[1]);
    delete p;
}